

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_handler.cpp
# Opt level: O1

spv_result_t __thiscall
spvtools::AssemblyContext::recordTypeDefinition(AssemblyContext *this,spv_instruction_t *pInst)

{
  spv_id_to_type_map *this_00;
  uint32_t uVar1;
  uint uVar2;
  pointer puVar3;
  ulong uVar4;
  _Hash_node_base *p_Var5;
  mapped_type *pmVar6;
  ulong uVar7;
  long lVar8;
  __node_base_ptr p_Var9;
  char *pcVar10;
  __node_base_ptr p_Var11;
  uint32_t value;
  uint local_1fc;
  DiagnosticStream local_1f8;
  
  puVar3 = (pInst->words).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_1fc = puVar3[1];
  uVar4 = (this->types_)._M_h._M_bucket_count;
  uVar7 = (ulong)local_1fc % uVar4;
  p_Var9 = (this->types_)._M_h._M_buckets[uVar7];
  p_Var11 = (__node_base_ptr)0x0;
  if ((p_Var9 != (__node_base_ptr)0x0) &&
     (p_Var5 = p_Var9->_M_nxt, p_Var11 = p_Var9, local_1fc != *(uint *)&p_Var9->_M_nxt[1]._M_nxt)) {
    while (p_Var9 = p_Var5, p_Var5 = p_Var9->_M_nxt, p_Var5 != (_Hash_node_base *)0x0) {
      p_Var11 = (__node_base_ptr)0x0;
      if (((ulong)*(uint *)&p_Var5[1]._M_nxt % uVar4 != uVar7) ||
         (p_Var11 = p_Var9, local_1fc == *(uint *)&p_Var5[1]._M_nxt)) goto LAB_0019c68b;
    }
    p_Var11 = (__node_base_ptr)0x0;
  }
LAB_0019c68b:
  if ((p_Var11 == (__node_base_ptr)0x0) || (p_Var11->_M_nxt == (_Hash_node_base *)0x0)) {
    this_00 = &this->types_;
    if (pInst->opcode == OpTypeFloat) {
      if (1 < ((long)(pInst->words).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish - (long)puVar3 >> 2) - 3U) {
        diagnostic(&local_1f8,this,SPV_ERROR_INVALID_TEXT);
        pcVar10 = "Invalid OpTypeFloat instruction";
        lVar8 = 0x1f;
        goto LAB_0019c7b1;
      }
      uVar1 = puVar3[2];
      pmVar6 = std::__detail::
               _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::IdType>,_std::allocator<std::pair<const_unsigned_int,_spvtools::IdType>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::IdType>,_std::allocator<std::pair<const_unsigned_int,_spvtools::IdType>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)this_00,&local_1fc);
      pmVar6->bitwidth = uVar1;
      pmVar6->isSigned = false;
      pmVar6->type_class = kScalarFloatType;
    }
    else if (pInst->opcode == OpTypeInt) {
      if ((long)(pInst->words).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)puVar3 != 0x10) {
        diagnostic(&local_1f8,this,SPV_ERROR_INVALID_TEXT);
        pcVar10 = "Invalid OpTypeInt instruction";
        lVar8 = 0x1d;
        goto LAB_0019c7b1;
      }
      uVar1 = puVar3[2];
      uVar2 = puVar3[3];
      pmVar6 = std::__detail::
               _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::IdType>,_std::allocator<std::pair<const_unsigned_int,_spvtools::IdType>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::IdType>,_std::allocator<std::pair<const_unsigned_int,_spvtools::IdType>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)this_00,&local_1fc);
      pmVar6->bitwidth = uVar1;
      pmVar6->isSigned = uVar2 != 0;
      pmVar6->type_class = kScalarIntegerType;
    }
    else {
      pmVar6 = std::__detail::
               _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::IdType>,_std::allocator<std::pair<const_unsigned_int,_spvtools::IdType>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::IdType>,_std::allocator<std::pair<const_unsigned_int,_spvtools::IdType>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)this_00,&local_1fc);
      pmVar6->bitwidth = 0;
      pmVar6->isSigned = false;
      pmVar6->type_class = kOtherType;
    }
    local_1f8.error_ = SPV_SUCCESS;
  }
  else {
    diagnostic(&local_1f8,this,SPV_ERROR_INVALID_TEXT);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f8,"Value ",6);
    std::ostream::_M_insert<unsigned_long>((ulong)&local_1f8);
    pcVar10 = " has already been used to generate a type";
    lVar8 = 0x29;
LAB_0019c7b1:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f8,pcVar10,lVar8);
    DiagnosticStream::~DiagnosticStream(&local_1f8);
  }
  return local_1f8.error_;
}

Assistant:

spv_result_t AssemblyContext::recordTypeDefinition(
    const spv_instruction_t* pInst) {
  uint32_t value = pInst->words[1];
  if (types_.find(value) != types_.end()) {
    return diagnostic() << "Value " << value
                        << " has already been used to generate a type";
  }

  if (pInst->opcode == spv::Op::OpTypeInt) {
    if (pInst->words.size() != 4)
      return diagnostic() << "Invalid OpTypeInt instruction";
    types_[value] = {pInst->words[2], pInst->words[3] != 0,
                     IdTypeClass::kScalarIntegerType};
  } else if (pInst->opcode == spv::Op::OpTypeFloat) {
    if ((pInst->words.size() != 3) && (pInst->words.size() != 4))
      return diagnostic() << "Invalid OpTypeFloat instruction";
    // TODO(kpet) Do we need to record the FP Encoding here?
    types_[value] = {pInst->words[2], false, IdTypeClass::kScalarFloatType};
  } else {
    types_[value] = {0, false, IdTypeClass::kOtherType};
  }
  return SPV_SUCCESS;
}